

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompression.cpp
# Opt level: O2

void testCompression(string *tempDir)

{
  long lVar1;
  long lVar2;
  half *phVar3;
  uint16_t uVar4;
  undefined2 uVar5;
  float fVar6;
  uint uVar7;
  ostream *poVar8;
  float *in_RCX;
  int iVar9;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong uVar10;
  ulong extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 uVar11;
  undefined8 extraout_RDX_09;
  long lVar12;
  ulong uVar13;
  int in_R8D;
  int in_R9D;
  int x_3;
  int y;
  long lVar14;
  ulong uVar15;
  int x;
  long lVar16;
  ulong uVar17;
  double __x;
  double dVar18;
  double dVar19;
  pixelArray array;
  ushort local_36 [3];
  
  poVar8 = std::operator<<((ostream *)&std::cout,
                           "Testing pixel data types, subsampling and compression schemes");
  std::endl<char,std::char_traits<char>>(poVar8);
  anon_unknown.dwarf_8c8a1::pixelArray::pixelArray(&array,0x9f,0x55b);
  poVar8 = std::operator<<((ostream *)&std::cout,"only zeroes");
  std::endl<char,std::char_traits<char>>(poVar8);
  uVar11 = extraout_RDX;
  for (lVar14 = 0; lVar14 != 0x9f; lVar14 = lVar14 + 1) {
    for (lVar16 = 0; lVar16 != 0x55b; lVar16 = lVar16 + 1) {
      array.i._data[array.i._sizeY * lVar14 + lVar16] = 0;
      Imath_3_2::half::operator=(array.h._data + array.h._sizeY * lVar14 + lVar16,0.0);
      array.f._data[array.f._sizeY * lVar14 + lVar16] = 0.0;
      uVar11 = extraout_RDX_00;
      for (lVar12 = 0; lVar12 != 0x60; lVar12 = lVar12 + 0x18) {
        Imath_3_2::half::operator=
                  ((half *)(*(long *)((long)&array.rgba[0]._sizeY + lVar12) * lVar14 * 2 +
                            *(long *)((long)&array.rgba[0]._data + lVar12) + lVar16 * 2),0.0);
        uVar11 = extraout_RDX_01;
      }
    }
  }
  anon_unknown.dwarf_8c8a1::writeRead(tempDir,&array,(int)uVar11,(int)in_RCX,in_R8D,in_R9D);
  poVar8 = std::operator<<((ostream *)&std::cout,"pattern 1");
  std::endl<char,std::char_traits<char>>(poVar8);
  uVar11 = extraout_RDX_02;
  for (lVar14 = 0; lVar14 != 0x9f; lVar14 = lVar14 + 1) {
    for (lVar16 = 0; lVar16 != 0x55b; lVar16 = lVar16 + 1) {
      in_RCX = (float *)(array.i._data + array.i._sizeY * lVar14);
      fVar6 = (float)((int)lVar16 + (int)lVar14 & 1);
      in_RCX[lVar16] = fVar6;
      Imath_3_2::half::operator=(array.h._data + array.h._sizeY * lVar14 + lVar16,(float)(int)fVar6)
      ;
      array.f._data[array.f._sizeY * lVar14 + lVar16] =
           (float)array.i._data[array.i._sizeY * lVar14 + lVar16];
      uVar11 = extraout_RDX_03;
      for (lVar12 = 0; lVar12 != 0x60; lVar12 = lVar12 + 0x18) {
        Imath_3_2::half::operator=
                  ((half *)(*(long *)((long)&array.rgba[0]._sizeY + lVar12) * lVar14 * 2 +
                            *(long *)((long)&array.rgba[0]._data + lVar12) + lVar16 * 2),
                   (float)array.i._data[array.i._sizeY * lVar14 + lVar16]);
        uVar11 = extraout_RDX_04;
      }
    }
  }
  anon_unknown.dwarf_8c8a1::writeRead(tempDir,&array,(int)uVar11,(int)in_RCX,in_R8D,in_R9D);
  poVar8 = std::operator<<((ostream *)&std::cout,"pattern 2");
  std::endl<char,std::char_traits<char>>(poVar8);
  uVar10 = extraout_RDX_05;
  for (uVar15 = 0; uVar15 != 0x9f; uVar15 = uVar15 + 1) {
    in_RCX = (float *)0x64;
    uVar10 = (uVar15 & 0xffffffff) % 100;
    iVar9 = (int)uVar10;
    __x = (double)(int)uVar15 * 0.5;
    for (uVar17 = 0; uVar17 != 0x55b; uVar17 = uVar17 + 1) {
      in_RCX = (float *)(array.i._data + array.i._sizeY * uVar15);
      in_RCX[uVar17] = (float)((uint)(ushort)uVar17 % 100 + iVar9 * 100);
      dVar18 = sin((double)(int)uVar17);
      dVar19 = sin(__x);
      Imath_3_2::half::operator=
                (array.h._data + array.h._sizeY * uVar15 + uVar17,(float)(dVar19 + dVar18));
      dVar18 = sin((double)(int)uVar15);
      dVar19 = sin((double)(int)uVar17 * 0.5);
      array.f._data[array.f._sizeY * uVar15 + uVar17] = (float)(dVar19 + dVar18);
      uVar13 = uVar17 & 0xffffffff;
      uVar10 = extraout_RDX_06;
      for (lVar14 = 0; lVar14 != 0x60; lVar14 = lVar14 + 0x18) {
        dVar18 = sin((double)(int)uVar13);
        dVar19 = sin(__x);
        Imath_3_2::half::operator=
                  ((half *)(*(long *)((long)&array.rgba[0]._sizeY + lVar14) * uVar15 * 2 +
                            *(long *)((long)&array.rgba[0]._data + lVar14) + uVar17 * 2),
                   (float)(dVar19 + dVar18));
        uVar13 = (ulong)((int)uVar13 + 1);
        uVar10 = extraout_RDX_07;
      }
    }
  }
  anon_unknown.dwarf_8c8a1::writeRead(tempDir,&array,(int)uVar10,(int)in_RCX,in_R8D,in_R9D);
  poVar8 = std::operator<<((ostream *)&std::cout,"random bits");
  std::endl<char,std::char_traits<char>>(poVar8);
  local_36[0] = 0x5a5a;
  local_36[1] = 0x5a5a;
  local_36[2] = 0x5a5a;
  uVar11 = extraout_RDX_08;
  for (lVar14 = 0; lVar14 != 0x9f; lVar14 = lVar14 + 1) {
    for (lVar16 = 0; lVar16 != 0x55b; lVar16 = lVar16 + 1) {
      uVar7 = Imath_3_2::nrand48(local_36);
      phVar3 = array.h._data;
      lVar12 = array.h._sizeY;
      array.i._data[array.i._sizeY * lVar14 + lVar16] = uVar7;
      uVar4 = Imath_3_2::nrand48(local_36);
      phVar3[lVar12 * lVar14 + lVar16]._h = uVar4;
      for (lVar12 = 0; lVar12 != 0x60; lVar12 = lVar12 + 0x18) {
        lVar1 = *(long *)((long)&array.rgba[0]._sizeY + lVar12);
        lVar2 = *(long *)((long)&array.rgba[0]._data + lVar12);
        uVar5 = Imath_3_2::nrand48(local_36);
        *(undefined2 *)(lVar1 * lVar14 * 2 + lVar2 + lVar16 * 2) = uVar5;
      }
      fVar6 = (float)Imath_3_2::nrand48(local_36);
      in_RCX = array.f._data + array.f._sizeY * lVar14;
      in_RCX[lVar16] = fVar6;
      uVar11 = extraout_RDX_09;
    }
  }
  anon_unknown.dwarf_8c8a1::writeRead(tempDir,&array,(int)uVar11,(int)in_RCX,in_R8D,in_R9D);
  poVar8 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::endl<char,std::char_traits<char>>(poVar8);
  anon_unknown.dwarf_8c8a1::pixelArray::~pixelArray(&array);
  return;
}

Assistant:

void
testCompression (const std::string& tempDir)
{
    try
    {
        cout << "Testing pixel data types, "
                "subsampling and "
                "compression schemes"
             << endl;

        const int W  = 1371;
        const int H  = 159;
        const int DX = 17;
        const int DY = 29;

        pixelArray array (H, W);

        //
        // If the following assertion fails, new pixel types have
        // been added to the Imf library; testing code for the new
        // pixel types should be added to this file.
        //

        assert (NUM_PIXELTYPES == 3);

        fillPixels1 (array, W, H);
        writeRead (tempDir, array, W, H, DX, DY);

        fillPixels2 (array, W, H);
        writeRead (tempDir, array, W, H, DX, DY);

        fillPixels3 (array, W, H);
        writeRead (tempDir, array, W, H, DX, DY);

        fillPixels4 (array, W, H);
        writeRead (tempDir, array, W, H, DX, DY);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}